

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O2

int lj_cf_string_dump(lua_State *L)

{
  TValue *pTVar1;
  int iVar2;
  GCfunc *pGVar3;
  uint strip;
  luaL_Buffer b;
  
  pGVar3 = lj_lib_checkfunc(L,1);
  pTVar1 = L->base + 1;
  strip = 0;
  if (pTVar1 < L->top) {
    strip = (uint)(*(uint *)((long)L->base + 0xc) < 0xfffffffe);
  }
  L->top = pTVar1;
  b.p = b.buffer;
  b.lvl = 0;
  b.L = L;
  if ((pGVar3->c).ffid == '\0') {
    iVar2 = lj_bcwrite(L,(GCproto *)((ulong)(pGVar3->c).pc.ptr32 - 0x40),writer_buf,&b,strip);
    if (iVar2 == 0) {
      luaL_pushresult(&b);
      return 1;
    }
  }
  lj_err_caller(L,LJ_ERR_STRDUMP);
}

Assistant:

LJLIB_CF(string_dump)
{
  GCfunc *fn = lj_lib_checkfunc(L, 1);
  int strip = L->base+1 < L->top && tvistruecond(L->base+1);
  luaL_Buffer b;
  L->top = L->base+1;
  luaL_buffinit(L, &b);
  if (!isluafunc(fn) || lj_bcwrite(L, funcproto(fn), writer_buf, &b, strip))
    lj_err_caller(L, LJ_ERR_STRDUMP);
  luaL_pushresult(&b);
  return 1;
}